

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O0

longdouble *
chaiscript::bootstrap::parse_string<long_double>(longdouble *__return_storage_ptr__,string *i)

{
  _Ios_Openmode _Var1;
  longdouble *plVar2;
  undefined1 auStack_1a8 [8];
  longdouble t;
  stringstream ss;
  string *i_local;
  
  _Var1 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)((long)&t + 8),(string *)__return_storage_ptr__,_Var1);
  std::istream::operator>>((istream *)((long)&t + 8),(longdouble *)auStack_1a8);
  plVar2 = (longdouble *)std::__cxx11::stringstream::~stringstream((stringstream *)((long)&t + 8));
  return plVar2;
}

Assistant:

Input parse_string(const std::string &i) {
    if constexpr (!std::is_same<Input, wchar_t>::value && !std::is_same<Input, char16_t>::value && !std::is_same<Input, char32_t>::value) {
      std::stringstream ss(i);
      Input t;
      ss >> t;
      return t;
    } else {
      throw std::runtime_error("Parsing of wide characters is not yet supported");
    }
  }